

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O1

uint8 ecx_prevport(ecx_contextt *context,uint16 slave,uint8 port)

{
  byte bVar1;
  uint8 uVar2;
  uint8 pport;
  undefined3 in_register_00000011;
  undefined6 in_register_00000032;
  
  if (3 < CONCAT31(in_register_00000011,port)) {
    return port;
  }
  bVar1 = context->slavelist[CONCAT62(in_register_00000032,slave) & 0xffffffff].activeports;
  switch(CONCAT31(in_register_00000011,port)) {
  case 1:
    if ((bVar1 & 8) != 0) {
      return '\x03';
    }
    if ((bVar1 & 1) != 0) {
      return '\0';
    }
    bVar1 = bVar1 & 4;
    uVar2 = '\x02';
    break;
  case 2:
    if ((bVar1 & 2) != 0) {
      return '\x01';
    }
    if ((bVar1 & 8) != 0) {
      return '\x03';
    }
    if ((bVar1 & 1) == 0) {
      return port;
    }
    return '\0';
  case 3:
    if ((bVar1 & 1) != 0) {
      return '\0';
    }
  case 0:
    if ((bVar1 & 4) != 0) {
      return '\x02';
    }
    bVar1 = bVar1 & 2;
    uVar2 = '\x01';
  }
  if (bVar1 == 0) {
    uVar2 = port;
  }
  return uVar2;
}

Assistant:

static uint8 ecx_prevport(ecx_contextt *context, uint16 slave, uint8 port)
{
   uint8 pport = port;
   uint8 aport = context->slavelist[slave].activeports;
   switch(port)
   {
      case 0:
         if(aport & PORTM2)
            pport = 2;
         else if (aport & PORTM1)
            pport = 1;
         else if (aport & PORTM2)
            pport = 3;
         break;
      case 1:
         if(aport & PORTM3)
            pport = 3;
         else if (aport & PORTM0)
            pport = 0;
         else if (aport & PORTM2)
            pport = 2;
         break;
      case 2:
         if(aport & PORTM1)
            pport = 1;
         else if (aport & PORTM3)
            pport = 3;
         else if (aport & PORTM0)
            pport = 0;
         break;
      case 3:
         if(aport & PORTM0)
            pport = 0;
         else if (aport & PORTM2)
            pport = 2;
         else if (aport & PORTM1)
            pport = 1;
         break;
   }      
   return pport;
}